

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

bool __thiscall LTFlightData::validForAcCreate(LTFlightData *this,double simTime)

{
  ulong uVar1;
  _Map_pointer pppVar2;
  _Map_pointer pppVar3;
  _Elt_pointer ppVar4;
  int iVar5;
  positionTy *ppVar6;
  reference p2;
  long lVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  iterator *this_00;
  double dVar11;
  positionTy local_b0;
  positionTy local_68;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->dataAccessMutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  if (((this->acKey).key._M_string_length != 0) &&
     ((this->dynDataDeque).
      super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->dynDataDeque).
      super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur)) {
    pppVar2 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    pppVar3 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    ppVar4 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((1 < ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar4 >> 3) *
             -0x71c71c71c71c71c7 +
             ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x71c71c71c71c71c7 +
             (((long)pppVar2 - (long)pppVar3 >> 3) + -1 + (ulong)(pppVar2 == (_Map_pointer)0x0)) * 7
        ) && (dVar11 = (double)(~-(ulong)NAN(simTime) & (ulong)simTime |
                               (ulong)dataRefs.lastSimTime & -(ulong)NAN(simTime)),
             ppVar4->_ts <= dVar11)) {
      lVar9 = (long)ppVar4 -
              (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_first;
      lVar7 = lVar9 >> 3;
      uVar1 = lVar7 * -0x71c71c71c71c71c7 + 1;
      if (lVar9 < -0x8f) {
        uVar10 = ~((lVar7 * 0x71c71c71c71c71c7 - 2U) / 7);
LAB_0016c0d2:
        ppVar6 = pppVar3[uVar10] + uVar10 * -7 + uVar1;
      }
      else {
        if (6 < uVar1) {
          uVar10 = uVar1 / 7;
          goto LAB_0016c0d2;
        }
        ppVar6 = ppVar4 + 1;
      }
      if (dVar11 < ppVar6->_ts) {
        DataRefs::GetViewPos();
        this_00 = &(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                   _M_impl.super__Deque_impl_data._M_start;
        dVar11 = CoordDistance(&local_68,this_00->_M_cur);
        if (dVar11 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
          DataRefs::GetViewPos();
          p2 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[](this_00,1);
          dVar11 = CoordDistance(&local_b0,p2);
          if (dVar11 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
            bVar8 = true;
            goto LAB_0016c161;
          }
        }
      }
    }
  }
  bVar8 = false;
LAB_0016c161:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  return bVar8;
}

Assistant:

bool LTFlightData::validForAcCreate(double simTime) const
{
    // access guarded by a mutex
    std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

    // the obvious stuff first: we need basic data
    if ( empty() || dynDataDeque.empty() || posDeque.size() < 2 )
        return false;

    // simTime defaults to 'now'
    if (std::isnan(simTime))
        simTime = dataRefs.GetSimTime();

    // so we have two positions...
    // if it is _not_ one in the past, one in the future, then bail
    if (!(posDeque.front().ts() <= simTime && simTime < posDeque[1].ts()))
        return false;
    
    // So first pos is in the past, second in the future, great...
    // both are within limits in terms of distance?
    if (CoordDistance(dataRefs.GetViewPos(), posDeque.front()) > dataRefs.GetFdStdDistance_m() ||
        CoordDistance(dataRefs.GetViewPos(), posDeque[1]     ) > dataRefs.GetFdStdDistance_m())
        return false;

    // All checks passed
    return true;
}